

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImBoolVector::SetBit(ImBoolVector *this,int n,bool v)

{
  uint *puVar1;
  undefined3 in_register_00000011;
  uint uVar2;
  
  uVar2 = 1 << ((byte)n & 0x1f);
  if (CONCAT31(in_register_00000011,v) == 0) {
    puVar1 = (uint *)ImVector<int>::operator[]((ImVector<int> *)this,n >> 5);
    *puVar1 = *puVar1 & ~uVar2;
  }
  else {
    puVar1 = (uint *)ImVector<int>::operator[]((ImVector<int> *)this,n >> 5);
    *puVar1 = *puVar1 | uVar2;
  }
  return;
}

Assistant:

void            SetBit(int n, bool v)   { int off = (n >> 5); int mask = 1 << (n & 31); if (v) Storage[off] |= mask; else Storage[off] &= ~mask; }